

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::allTrueI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  bool bVar1;
  int32_t iVar2;
  Literal *in_RDX;
  long lVar3;
  undefined1 local_a0 [8];
  LaneArray<4> lanes;
  
  getLanes<int,4>((LaneArray<4> *)local_a0,(wasm *)this,in_RDX);
  lVar3 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[3].type;
  do {
    makeZero((Literal *)__return_storage_ptr___00,
             (Type)*(uintptr_t *)((long)&lanes._M_elems[0].field_0 + lVar3 + 8));
    bVar1 = operator==((Literal *)(local_a0 + lVar3),(Literal *)__return_storage_ptr___00);
    ~Literal((Literal *)__return_storage_ptr___00);
    if (bVar1) {
      iVar2 = 0;
      goto LAB_00c4b92c;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x60);
  iVar2 = 1;
LAB_00c4b92c:
  (__return_storage_ptr__->field_0).i32 = iVar2;
  (__return_storage_ptr__->type).id = 2;
  lVar3 = 0x48;
  do {
    ~Literal((Literal *)(local_a0 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::allTrueI32x4() const {
  return all_true<4, &Literal::getLanesI32x4>(*this);
}